

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetB.c
# Opt level: O0

int point_mul_id_tc26_gost_3410_2012_512_paramSetB
              (EC_GROUP *group,EC_POINT *r,EC_POINT *q,BIGNUM *m,BN_CTX *ctx)

{
  int iVar1;
  BIGNUM *pBVar2;
  BIGNUM *pBVar3;
  long lVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  EC_POINT *in_RSI;
  EC_GROUP *in_RDI;
  BN_CTX *in_R8;
  BIGNUM *y;
  BIGNUM *x;
  uchar b_m [64];
  uchar b_y [64];
  uchar b_x [64];
  int ret;
  undefined1 local_f8 [64];
  undefined1 local_b8 [40];
  uchar *in_stack_ffffffffffffff70;
  uchar *in_stack_ffffffffffffff78;
  uchar *in_stack_ffffffffffffff80;
  uchar *in_stack_ffffffffffffff88;
  uchar *in_stack_ffffffffffffff90;
  int local_2c;
  
  local_2c = 0;
  BN_CTX_start(in_R8);
  pBVar2 = BN_CTX_get(in_R8);
  pBVar3 = BN_CTX_get(in_R8);
  if ((((pBVar3 != (BIGNUM *)0x0) &&
       (iVar1 = EC_POINT_get_affine_coordinates(in_RDI,in_RDX,pBVar2,pBVar3,in_R8), iVar1 != 0)) &&
      (iVar1 = BN_bn2lebinpad(pBVar2,&stack0xffffffffffffff88,0x40), iVar1 == 0x40)) &&
     ((iVar1 = BN_bn2lebinpad(pBVar3,local_b8,0x40), iVar1 == 0x40 &&
      (iVar1 = BN_bn2lebinpad(in_RCX,local_f8,0x40), iVar1 == 0x40)))) {
    point_mul(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
              in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    iVar1 = CRYPTO_memcmp("",&stack0xffffffffffffff88,0x40);
    if ((iVar1 == 0) && (iVar1 = CRYPTO_memcmp("",local_b8,0x40), iVar1 == 0)) {
      iVar1 = EC_POINT_set_to_infinity(in_RDI,in_RSI);
    }
    else {
      lVar4 = BN_lebin2bn(&stack0xffffffffffffff88,0x40,pBVar2);
      if ((lVar4 == 0) || (lVar4 = BN_lebin2bn(local_b8,0x40,pBVar3), lVar4 == 0))
      goto LAB_00158ddc;
      iVar1 = EC_POINT_set_affine_coordinates(in_RDI,in_RSI,pBVar2,pBVar3,in_R8);
    }
    if (iVar1 != 0) {
      local_2c = 1;
    }
  }
LAB_00158ddc:
  BN_CTX_end(in_R8);
  return local_2c;
}

Assistant:

int
    point_mul_id_tc26_gost_3410_2012_512_paramSetB(const EC_GROUP *group,
                                                   EC_POINT *r,
                                                   const EC_POINT *q,
                                                   const BIGNUM *m,
                                                   BN_CTX *ctx) {
    int ret = 0;
    unsigned char b_x[64];
    unsigned char b_y[64];
    unsigned char b_m[64];
    BIGNUM *x = NULL, *y = NULL;

    BN_CTX_start(ctx);
    x = BN_CTX_get(ctx);
    if ((y = BN_CTX_get(ctx)) == NULL
        /* pull out coords as bytes */
        || !EC_POINT_get_affine_coordinates(group, q, x, y, ctx) ||
        BN_bn2lebinpad(x, b_x, 64) != 64 || BN_bn2lebinpad(y, b_y, 64) != 64 ||
        BN_bn2lebinpad(m, b_m, 64) != 64)
        goto err;
    /* do the variable scalar multiplication */
    point_mul(b_x, b_y, b_m, b_x, b_y);
    /* check for infinity */
    if (CRYPTO_memcmp(const_zb, b_x, 64) == 0 &&
        CRYPTO_memcmp(const_zb, b_y, 64) == 0) {
        if (!EC_POINT_set_to_infinity(group, r)) goto err;
    } else {
        /* otherwise, pack the bytes into the result */
        if (BN_lebin2bn(b_x, 64, x) == NULL ||
            BN_lebin2bn(b_y, 64, y) == NULL ||
            !EC_POINT_set_affine_coordinates(group, r, x, y, ctx))
            goto err;
    }
    ret = 1;
err:
    BN_CTX_end(ctx);
    return ret;
}